

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::Value::Value(Value *this,string_view s)

{
  uint8_t *dest;
  string_view text;
  Handle src;
  Type local_40;
  Value *local_20;
  Value *this_local;
  string_view s_local;
  
  s_local._M_len = (size_t)s._M_str;
  this_local = (Value *)s._M_len;
  local_20 = this;
  Type::createString();
  Value(this,&local_40);
  Type::~Type(&local_40);
  dest = (this->value).data;
  text._M_str = (char *)s_local._M_len;
  text._M_len = (size_t)this_local;
  src = SimpleStringDictionary::getHandleForString(&this->dictionary,text);
  anon_unknown_15::writeUnaligned<choc::value::StringDictionary::Handle>(dest,src);
  return;
}

Assistant:

inline Value::Value (std::string_view s)  : Value (Type::createString())   { writeUnaligned (value.data, dictionary.getHandleForString (s)); }